

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

bool google::GetSectionHeaderByType
               (int fd,Elf64_Half sh_num,size_t sh_offset,Elf64_Word type,Elf64_Shdr *out)

{
  ulong uVar1;
  size_t local_470;
  ulong local_468;
  size_t j;
  size_t num_headers_in_buf;
  ssize_t len;
  size_t num_bytes_to_read;
  size_t num_bytes_left;
  size_t i;
  Elf64_Shdr buf [16];
  Elf64_Shdr *out_local;
  Elf64_Word type_local;
  size_t sh_offset_local;
  Elf64_Half sh_num_local;
  int fd_local;
  
  num_bytes_left = 0;
  while( true ) {
    if (sh_num <= num_bytes_left) {
      return false;
    }
    local_470 = (sh_num - num_bytes_left) * 0x40;
    if (0x3ff < local_470) {
      local_470 = 0x400;
    }
    uVar1 = ReadFromOffset(fd,&i,local_470,sh_offset + num_bytes_left * 0x40);
    if (uVar1 == 0xffffffffffffffff) {
      return false;
    }
    if ((uVar1 & 0x3f) != 0) {
      abort();
    }
    uVar1 = uVar1 >> 6;
    if (0x10 < uVar1) break;
    for (local_468 = 0; local_468 < uVar1; local_468 = local_468 + 1) {
      if (*(Elf64_Word *)((long)&buf[local_468 - 1].sh_entsize + 4) == type) {
        memcpy(out,&buf[local_468 - 1].sh_entsize,0x40);
        return true;
      }
    }
    num_bytes_left = uVar1 + num_bytes_left;
  }
  abort();
}

Assistant:

static ATTRIBUTE_NOINLINE bool GetSectionHeaderByType(const int fd,
                                                      ElfW(Half) sh_num,
                                                      const size_t sh_offset,
                                                      ElfW(Word) type,
                                                      ElfW(Shdr) * out) {
  // Read at most 16 section headers at a time to save read calls.
  ElfW(Shdr) buf[16];
  for (size_t i = 0; i < sh_num;) {
    const size_t num_bytes_left = (sh_num - i) * sizeof(buf[0]);
    const size_t num_bytes_to_read =
        (sizeof(buf) > num_bytes_left) ? num_bytes_left : sizeof(buf);
    const ssize_t len = ReadFromOffset(fd, buf, num_bytes_to_read,
                                       sh_offset + i * sizeof(buf[0]));
    if (len == -1) {
      return false;
    }
    GLOG_SAFE_ASSERT(static_cast<size_t>(len) % sizeof(buf[0]) == 0);
    const size_t num_headers_in_buf = static_cast<size_t>(len) / sizeof(buf[0]);
    GLOG_SAFE_ASSERT(num_headers_in_buf <= sizeof(buf) / sizeof(buf[0]));
    for (size_t j = 0; j < num_headers_in_buf; ++j) {
      if (buf[j].sh_type == type) {
        *out = buf[j];
        return true;
      }
    }
    i += num_headers_in_buf;
  }
  return false;
}